

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

void DrawTriangleFan(Vector2 *points,int pointCount,Color color)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  
  if (2 < pointCount) {
    rlSetTexture(texShapes.id);
    uVar3 = texShapesRec._8_8_;
    uVar2 = texShapesRec._0_8_;
    rlBegin(7);
    rlColor4ub(color.r,color.g,color.b,color.a);
    local_68 = (float)uVar2;
    fStack_64 = SUB84(uVar2,4);
    local_78 = (float)uVar3;
    fStack_74 = SUB84(uVar3,4);
    uVar4 = 1;
    do {
      rlTexCoord2f(local_68 / (float)texShapes.width,fStack_64 / (float)texShapes.height);
      rlVertex2f(points->x,points->y);
      rlTexCoord2f(local_68 / (float)texShapes.width,
                   (fStack_74 + fStack_64) / (float)texShapes.height);
      rlVertex2f(points[uVar4].x,points[uVar4].y);
      rlTexCoord2f((local_78 + local_68) / (float)texShapes.width,
                   (fStack_74 + fStack_64) / (float)texShapes.height);
      uVar1 = uVar4 + 1;
      rlVertex2f(points[uVar4 + 1].x,points[uVar4 + 1].y);
      rlTexCoord2f((local_78 + local_68) / (float)texShapes.width,
                   fStack_64 / (float)texShapes.height);
      rlVertex2f(points[uVar4 + 1].x,points[uVar4 + 1].y);
      uVar4 = uVar1;
    } while (pointCount - 1 != uVar1);
    rlEnd();
    rlSetTexture(0);
    return;
  }
  return;
}

Assistant:

void DrawTriangleFan(const Vector2 *points, int pointCount, Color color)
{
    if (pointCount >= 3)
    {
        rlSetTexture(GetShapesTexture().id);
        Rectangle shapeRect = GetShapesTextureRectangle();

        rlBegin(RL_QUADS);
            rlColor4ub(color.r, color.g, color.b, color.a);

            for (int i = 1; i < pointCount - 1; i++)
            {
                rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
                rlVertex2f(points[0].x, points[0].y);

                rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
                rlVertex2f(points[i].x, points[i].y);

                rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
                rlVertex2f(points[i + 1].x, points[i + 1].y);

                rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
                rlVertex2f(points[i + 1].x, points[i + 1].y);
            }
        rlEnd();
        rlSetTexture(0);
    }
}